

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O1

string * duckdb_apache::thrift::to_string<bool>
                   (string *__return_storage_ptr__,vector<bool,_true> *t)

{
  ostream *poVar1;
  ostringstream o;
  string local_1d0;
  _Bit_const_iterator local_1b0;
  _Bit_const_iterator local_1a0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[",1);
  local_1a0.super__Bit_iterator_base._M_p =
       (t->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
       _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  local_1a0.super__Bit_iterator_base._M_offset = 0;
  local_1b0.super__Bit_iterator_base._M_p =
       (t->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
       _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  local_1b0.super__Bit_iterator_base._M_offset =
       (t->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
       _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  to_string<std::_Bit_const_iterator>(&local_1d0,&local_1a0,&local_1b0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const duckdb::vector<T>& t) {
  std::ostringstream o;
  o << "[" << to_string(t.begin(), t.end()) << "]";
  return o.str();
}